

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall
VariationalBayesEstimatorOnLDA::updateBeta
          (VariationalBayesEstimatorOnLDA *this,BetaUpdateManner manner)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  int iVar4;
  pointer pdVar5;
  ulong uVar6;
  uint uVar7;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  integral_constant<int,_53> *extraout_RDX_07;
  integral_constant<int,_53> *extraout_RDX_08;
  integral_constant<int,_53> *extraout_RDX_09;
  integral_constant<int,_53> *extraout_RDX_10;
  integral_constant<int,_53> *extraout_RDX_11;
  integral_constant<int,_53> *extraout_RDX_12;
  integral_constant<int,_53> *t;
  integral_constant<int,_53> *extraout_RDX_13;
  integral_constant<int,_53> *extraout_RDX_14;
  integral_constant<int,_53> *piVar8;
  ulong uVar9;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  longdouble in_ST5;
  longdouble lVar15;
  longdouble in_ST6;
  double dVar16;
  double dVar17;
  double dVar18;
  double commonBeta;
  undefined1 local_e0 [39];
  detail local_b9;
  double local_b8;
  longdouble local_b0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (manner == SYMMETRY) {
    if (this->_K == 0) {
      local_e0._0_8_ = NAN;
    }
    else {
      dVar17 = 0.0;
      lVar12 = (longdouble)1.79769313486232e+308;
      dVar16 = 0.0;
      dVar18 = 0.0;
      do {
        local_e0._0_8_ = dVar18;
        local_b8 = dVar17;
        local_98 = dVar16;
        if (this->_V != 0) {
          pdVar5 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar10 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                     *)0x0;
          do {
            pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    **)&(this->_nkv).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)dVar17].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
            local_68 = *(double *)(pol + (long)ppVar10 * 8) + pdVar5[(long)ppVar10];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_68,in_RDX,pol);
            piVar8 = extraout_RDX_03;
            lVar14 = in_ST5;
            if (lVar12 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              piVar8 = extraout_RDX_04;
            }
            dVar18 = (double)in_ST0;
            local_70 = dVar18;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)ppVar10],piVar8,pol);
            in_RDX = extraout_RDX_05;
            lVar13 = in_ST1;
            in_ST0 = in_ST2;
            lVar1 = in_ST3;
            lVar2 = in_ST4;
            lVar3 = in_ST5;
            lVar15 = lVar14;
            if (lVar12 < ABS(in_ST1)) {
              local_b0 = in_ST1;
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              in_RDX = extraout_RDX_06;
              lVar13 = local_b0;
              in_ST0 = in_ST2;
              lVar1 = in_ST3;
              lVar2 = in_ST4;
              lVar3 = in_ST5;
            }
            in_ST5 = lVar15;
            in_ST4 = lVar14;
            in_ST3 = lVar3;
            in_ST2 = lVar2;
            in_ST1 = lVar1;
            local_78 = (double)lVar13;
            pdVar5 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_e0._0_8_ = (double)local_e0._0_8_ + (dVar18 - local_78) * pdVar5[(long)ppVar10];
            ppVar10 = ppVar10 + 1;
            in_RCX = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)(ulong)this->_V;
          } while (ppVar10 < in_RCX);
        }
        dVar17 = local_b8;
        local_80 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_b8] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_80,in_RDX,in_RCX);
        piVar8 = extraout_RDX_07;
        lVar14 = in_ST5;
        if (lVar12 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          piVar8 = extraout_RDX_08;
        }
        dVar18 = (double)in_ST0;
        local_88 = dVar18;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)this->_betaSum,piVar8,in_RCX);
        in_RDX = extraout_RDX_09;
        lVar13 = in_ST1;
        in_ST0 = in_ST2;
        lVar1 = in_ST3;
        lVar2 = in_ST4;
        lVar3 = in_ST5;
        lVar15 = lVar14;
        if (lVar12 < ABS(in_ST1)) {
          local_b0 = in_ST1;
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          in_RDX = extraout_RDX_10;
          lVar13 = local_b0;
          in_ST0 = in_ST2;
          lVar1 = in_ST3;
          lVar2 = in_ST4;
          lVar3 = in_ST5;
        }
        in_ST5 = lVar15;
        in_ST4 = lVar14;
        in_ST3 = lVar3;
        in_ST2 = lVar2;
        in_ST1 = lVar1;
        local_90 = (double)lVar13;
        dVar16 = local_98 + (dVar18 - local_90);
        dVar17 = (double)((long)dVar17 + 1);
        dVar18 = (double)local_e0._0_8_;
      } while ((ulong)dVar17 < (ulong)this->_K);
      local_e0._0_8_ = (double)local_e0._0_8_ / dVar16;
    }
    local_a0 = (double)local_e0._0_8_ / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->_beta,(ulong)this->_V,&local_a0);
  }
  else {
    if (this->_K == 0) {
      local_b8 = 0.0;
      uVar6 = 0;
    }
    else {
      local_b8 = 0.0;
      uVar9 = 0;
      do {
        local_38 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_38,in_RDX,in_RCX);
        piVar8 = extraout_RDX;
        lVar12 = in_ST1;
        lVar14 = in_ST3;
        lVar13 = in_ST5;
        if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          piVar8 = extraout_RDX_00;
          lVar12 = in_ST1;
          lVar14 = in_ST3;
          local_e0._0_10_ = in_ST0;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar14;
        dVar17 = (double)in_ST0;
        local_e0._0_8_ = dVar17;
        local_40 = dVar17;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)this->_betaSum,piVar8,in_RCX);
        in_RDX = extraout_RDX_01;
        in_ST0 = in_ST2;
        lVar14 = in_ST4;
        in_ST5 = lVar13;
        in_ST6 = lVar13;
        if ((longdouble)1.79769313486232e+308 < ABS(lVar12)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          in_RDX = extraout_RDX_02;
          in_ST0 = in_ST2;
          lVar14 = in_ST4;
        }
        in_ST4 = lVar13;
        in_ST2 = lVar14;
        local_48 = (double)lVar12;
        local_b8 = local_b8 + (dVar17 - local_48);
        uVar9 = uVar9 + 1;
        uVar6 = (ulong)this->_K;
      } while (uVar9 < uVar6);
    }
    uVar7 = this->_V;
    if (uVar7 != 0) {
      piVar8 = (integral_constant<int,_53> *)0x0;
      do {
        dVar17 = 0.0;
        iVar4 = (int)uVar6;
        uVar6 = 0;
        if (iVar4 != 0) {
          local_e0._0_10_ = (unkuint10)(ushort)local_e0._8_2_ << 0x40;
          lVar11 = 0;
          uVar9 = 0;
          lVar12 = in_ST1;
          lVar14 = in_ST3;
          do {
            in_ST3 = in_ST5;
            in_ST1 = lVar14;
            ppVar10 = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        **)((long)&(((this->_nkv).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar11);
            local_50 = *(double *)(ppVar10 + (long)piVar8 * 8) +
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar8];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,&local_b9,(longdouble)local_50,in_RDX,ppVar10);
            t = extraout_RDX_11;
            in_ST5 = in_ST6;
            if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              t = extraout_RDX_12;
            }
            local_58 = (double)in_ST0;
            local_b0 = (longdouble)CONCAT28(local_b0._8_2_,local_58);
            in_ST0 = in_ST2;
            in_ST2 = in_ST4;
            in_ST4 = in_ST6;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar8],t,ppVar10);
            in_RDX = extraout_RDX_13;
            in_ST6 = in_ST5;
            if ((longdouble)1.79769313486232e+308 < ABS(lVar12)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              in_RDX = extraout_RDX_14;
            }
            local_60 = (double)lVar12;
            dVar17 = (double)local_e0._0_8_ +
                     (local_b0._0_8_ - local_60) *
                     (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar8];
            local_e0._0_8_ = dVar17;
            uVar9 = uVar9 + 1;
            uVar6 = (ulong)this->_K;
            lVar11 = lVar11 + 0x18;
            lVar12 = in_ST1;
            lVar14 = in_ST3;
          } while (uVar9 < uVar6);
          uVar7 = this->_V;
        }
        (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)piVar8] = dVar17 / local_b8;
        piVar8 = piVar8 + 1;
        in_RDX = (integral_constant<int,_53> *)(ulong)uVar7;
      } while (piVar8 < in_RDX);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                try{
                    numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
                }catch(...){
                    numerator += 0;
                }
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}